

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O2

void __thiscall menuwindow::autoscroll(menuwindow *this,int n)

{
  int iVar1;
  int iVar2;
  int scr_h;
  int ww;
  int xx;
  int scr_y;
  
  iVar2 = (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
          super_Fl_Widget.y_;
  iVar1 = Fl::box_dx((uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                           super_Fl_Group.super_Fl_Widget.box_);
  iVar2 = n * this->itemheight + iVar1 + iVar2 + 2;
  Fl::screen_work_area(&xx,&scr_y,&ww,&scr_h);
  if (scr_y < iVar2) {
    iVar2 = (iVar2 + this->itemheight) - (scr_y + scr_h);
    if (iVar2 < 0) {
      return;
    }
    iVar2 = -10 - iVar2;
  }
  else {
    iVar2 = (scr_y - iVar2) + 10;
  }
  Fl_Widget::position((Fl_Widget *)this,
                      (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                      super_Fl_Group.super_Fl_Widget.x_,
                      iVar2 + (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                              super_Fl_Group.super_Fl_Widget.y_);
  return;
}

Assistant:

void menuwindow::autoscroll(int n) {
  int scr_y, scr_h;
  int Y = y()+Fl::box_dx(box())+2+n*itemheight;

  int xx, ww;
  Fl::screen_work_area(xx, scr_y, ww, scr_h);
  if (Y <= scr_y) Y = scr_y-Y+10;
  else {
    Y = Y+itemheight-scr_h-scr_y;
    if (Y < 0) return;
    Y = -Y-10;
  }
  Fl_Menu_Window::position(x(), y()+Y);
  // y(y()+Y); // don't wait for response from X
}